

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O3

flexScore negaMax(game *Game,int depth,flexScore alpha,flexScore beta)

{
  bool bVar1;
  move moveMade;
  long lVar2;
  ulong uVar3;
  game *pgVar4;
  game *pgVar5;
  byte bVar6;
  stack<bitboards,_std::deque<bitboards,_std::allocator<bitboards>_>_> *psVar7;
  ulong extraout_XMM0_Qb;
  flexScore beta_00;
  flexScore fVar8;
  flexScore fVar9;
  flexScore score;
  arrayMoveList moves;
  flexScore local_5b0;
  flexScore local_5a0;
  int local_58c;
  flexScore local_588;
  stack<bitboards,_std::deque<bitboards,_std::allocator<bitboards>_>_> *local_578;
  ulong uStack_570;
  stack<move,_std::deque<move,_std::allocator<move>_>_> *local_560;
  game local_558;
  game local_448;
  arrayMoveList local_338;
  
  local_5b0._8_8_ = beta._8_8_;
  local_5b0.score = beta.score;
  uVar3 = alpha._8_8_;
  local_588.score = alpha.score;
  bVar6 = 0;
  local_58c = depth;
  local_588._8_8_ = uVar3;
  if (depth == 0) {
    bVar1 = Game->blacksTurn;
    pgVar4 = Game;
    pgVar5 = &local_448;
    for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pgVar5->boards).WP = (pgVar4->boards).WP;
      pgVar4 = (game *)&(pgVar4->boards).WN;
      pgVar5 = (game *)&(pgVar5->boards).WN;
    }
    std::deque<bitboards,_std::allocator<bitboards>_>::deque
              (&local_448.boardHistory.c,&(Game->boardHistory).c);
    std::deque<move,_std::allocator<move>_>::deque(&local_448.history.c,&(Game->history).c);
    local_448.blacksTurn = Game->blacksTurn;
    local_578 = (stack<bitboards,_std::deque<bitboards,_std::allocator<bitboards>_>_> *)
                positionStrengthFast(&local_448);
    uStack_570 = extraout_XMM0_Qb;
    if (bVar1 != false) {
      local_578 = (stack<bitboards,_std::deque<bitboards,_std::allocator<bitboards>_>_> *)
                  -(double)local_578;
      uStack_570 = extraout_XMM0_Qb ^ 0x8000000000000000;
    }
    std::_Deque_base<move,_std::allocator<move>_>::~_Deque_base
              ((_Deque_base<move,_std::allocator<move>_> *)&local_448.history);
    std::_Deque_base<bitboards,_std::allocator<bitboards>_>::~_Deque_base
              ((_Deque_base<bitboards,_std::allocator<bitboards>_> *)&local_448.boardHistory);
    uVar3 = 0;
    psVar7 = local_578;
  }
  else {
    local_578 = (stack<bitboards,_std::deque<bitboards,_std::allocator<bitboards>_>_> *)
                local_588.score;
    game::generateLegalMoves(&local_338,Game);
    arrayMoveList::resetIterator(&local_338);
    bVar1 = arrayMoveList::next(&local_338);
    if (bVar1) {
      arrayMoveList::resetIterator(&local_338);
      bVar1 = arrayMoveList::next(&local_338);
      psVar7 = local_578;
      if (bVar1) {
        local_578 = &Game->boardHistory;
        local_560 = &Game->history;
        local_58c = local_58c + -1;
        do {
          moveMade = arrayMoveList::getMove(&local_338);
          game::makeMove(Game,moveMade);
          pgVar4 = Game;
          pgVar5 = &local_558;
          for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
            (pgVar5->boards).WP = (pgVar4->boards).WP;
            pgVar4 = (game *)((long)pgVar4 + (ulong)bVar6 * -0x10 + 8);
            pgVar5 = (game *)((long)pgVar5 + (ulong)bVar6 * -0x10 + 8);
          }
          std::deque<bitboards,_std::allocator<bitboards>_>::deque
                    (&local_558.boardHistory.c,&local_578->c);
          std::deque<move,_std::allocator<move>_>::deque(&local_558.history.c,&local_560->c);
          local_558.blacksTurn = Game->blacksTurn;
          fVar8._8_8_ = ((ulong)(local_5b0.count + 1) | local_5b0._8_8_ & 0xff01ffff00000000) ^
                        0x1000000000000;
          beta_00._8_8_ =
               ((ulong)(local_588.count + 1) | local_588._8_8_ & 0xff01ffff00000000) ^
               0x1000000000000;
          fVar8.score = local_5b0.score;
          beta_00.score = local_588.score;
          fVar8 = negaMax(&local_558,local_58c,fVar8,beta_00);
          local_5a0.score = fVar8.score;
          local_5a0._8_8_ =
               ((ulong)(fVar8.count - 1) | fVar8._8_8_ & 0xff01ffff00000000) ^ 0x1000000000000;
          std::_Deque_base<move,_std::allocator<move>_>::~_Deque_base
                    ((_Deque_base<move,_std::allocator<move>_> *)&local_558.history);
          std::_Deque_base<bitboards,_std::allocator<bitboards>_>::~_Deque_base
                    ((_Deque_base<bitboards,_std::allocator<bitboards>_> *)&local_558.boardHistory);
          game::undoMove(Game);
          bVar1 = flexScore::operator>(&local_5a0,&local_5b0);
          uVar3 = local_5b0._8_8_;
          psVar7 = (stack<bitboards,_std::deque<bitboards,_std::allocator<bitboards>_>_> *)
                   local_5b0.score;
          if (bVar1) break;
          if (local_5a0.extreme == local_5b0.extreme) {
            if (local_5a0.tethered == local_5b0.tethered) {
              if (local_5a0.draw == local_5b0.draw) {
                if (local_5a0.extreme == false) {
                  if (local_5a0.tethered == false) {
                    if ((local_5a0.score == local_5b0.score) &&
                       (!NAN(local_5a0.score) && !NAN(local_5b0.score))) break;
                  }
                  else if (local_5a0.draw == false) {
                    if (local_5a0.count == local_5b0.count) goto joined_r0x001033a9;
                  }
                  else if (local_5a0.count == local_5b0.count) break;
                }
                else {
joined_r0x001033a9:
                  if (local_5a0.favorable == local_5b0.favorable) break;
                }
              }
            }
          }
          bVar1 = flexScore::operator>(&local_5a0,&local_588);
          if (bVar1) {
            local_588.score = local_5a0.score;
            local_588.count = local_5a0.count;
            local_588.draw = local_5a0.draw;
            local_588.tethered = local_5a0.tethered;
            local_588.favorable = local_5a0.favorable;
            local_588.extreme = local_5a0.extreme;
          }
          bVar1 = arrayMoveList::next(&local_338);
          uVar3 = local_588._8_8_;
          psVar7 = (stack<bitboards,_std::deque<bitboards,_std::allocator<bitboards>_>_> *)
                   local_588.score;
        } while (bVar1);
      }
    }
    else {
      uVar3 = 0x10100000000;
      psVar7 = (stack<bitboards,_std::deque<bitboards,_std::allocator<bitboards>_>_> *)0.0;
    }
  }
  fVar9.count = (int)uVar3;
  fVar9.draw = (bool)(char)(uVar3 >> 0x20);
  fVar9.tethered = (bool)(char)(uVar3 >> 0x28);
  fVar9.favorable = (bool)(char)(uVar3 >> 0x30);
  fVar9.extreme = (bool)(char)(uVar3 >> 0x38);
  fVar9.score = (double)psVar7;
  return fVar9;
}

Assistant:

flexScore negaMax(game Game, int depth, flexScore alpha, flexScore beta) {
    if(depth == 0) {
      double side;
      if(Game.blacksTurn) {
        side = -1.0;
      } else {
        side = 1.0;
      }

      flexScore returner;
      returner.score = side*positionStrengthFast(Game);
      return returner;
    }

    arrayMoveList moves = Game.generateLegalMoves();
    moves.resetIterator();
    if(!moves.next()) {
      flexScore returner;
      returner.tethered = true;
      returner.count = 0;
      returner.draw = true; // We currently assume this is a draw
      return returner;
    }
    moves.resetIterator();
    while(moves.next()) {
      Game.makeMove(moves.getMove());
      flexScore score = -negaMax(Game, depth - 1, --beta, --alpha);
      Game.undoMove();
      if(score >= beta) {
        return beta;
      }
      if(score > alpha)
        alpha = score;
    }

    return alpha;
}